

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O2

ktx_error_code_e __thiscall
ktx::CommandInfo::printInfoJSON(CommandInfo *this,istream *file,bool minified)

{
  int iVar1;
  int iVar2;
  ktx_error_code_e kVar3;
  ulong uVar4;
  char *in_RCX;
  undefined7 in_register_00000011;
  ktx_error_code_e kVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  string_view filepath;
  format_args args;
  string_view fmt;
  bool first;
  char *nl;
  char *space;
  PrintIndent out;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  PrintIndent pi;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  _func_int **local_1b8;
  basic_streambuf<char,_std::char_traits<char>_> *pbStack_1b0;
  ostringstream messagesOS;
  
  iVar6 = (uint)!minified << 2;
  pcVar7 = "";
  space = " ";
  bVar8 = (int)CONCAT71(in_register_00000011,minified) != 0;
  if (bVar8) {
    space = "";
  }
  nl = "\n";
  if (bVar8) {
    nl = "";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&messagesOS);
  pi.indentBase = 0;
  first = true;
  filepath._M_str = in_RCX;
  filepath._M_len = (size_t)(this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
  pi.os = (ostream *)&messagesOS;
  pi.indentWidth = iVar6;
  fmtInFile_abi_cxx11_
            ((string *)&ktx2Stream,
             (ktx *)(this->options).super_OptionsSingleIn.inputFilepath._M_string_length,filepath);
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._M_unused._M_object = operator_new(0x20);
  *(bool **)local_1d8._M_unused._0_8_ = &first;
  *(PrintIndent **)((long)local_1d8._M_unused._0_8_ + 8) = &pi;
  *(char ***)((long)local_1d8._M_unused._0_8_ + 0x10) = &nl;
  *(char ***)((long)local_1d8._M_unused._0_8_ + 0x18) = &space;
  pcStack_1c0 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:170:106)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:170:106)>
              ::_M_manager;
  iVar1 = validateIOStream(file,(string *)&ktx2Stream,false,false,
                           (function<void_(const_ktx::ValidationReport_&)> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  std::__cxx11::string::~string((string *)&ktx2Stream);
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  std::istream::seekg((long)file,_S_beg);
  uVar4 = std::istream::tellg();
  if (0xb < (long)uVar4) {
    std::istream::seekg((long)file,_S_beg);
    std::istream::read((char *)file,(long)&ktx2Stream);
    iVar2 = bcmp(&ktx2Stream,printInfoJSON::ktx2_identifier_reference,0xc);
    if ((iVar2 == 0) && (pcVar7 = "", 0x4f < uVar4)) {
      pcVar7 = ",";
    }
  }
  out.os = (ostream *)&std::cout;
  out.indentBase = 0;
  out.indentWidth = iVar6;
  PrintIndent::operator()(&out,0,(char (*) [5])0x1cef39,&nl);
  PrintIndent::operator()
            (&out,1,(char (*) [61])
                    "\"$schema\":{}\"https://schema.khronos.org/ktx/info_v0.json\",{}",&space,&nl);
  ktx2Stream._vptr_StreambufStream =
       (_func_int **)CONCAT71(ktx2Stream._vptr_StreambufStream._1_7_,iVar1 == 0);
  PrintIndent::operator()(&out,1,(char (*) [16])"\"valid\":{}{},{}",&space,(bool *)&ktx2Stream,&nl);
  if (first == false) {
    PrintIndent::operator()(&out,1,(char (*) [17])"\"messages\":{}[{}",&space,&nl);
    std::__cxx11::stringbuf::str();
    local_1b8 = ktx2Stream._vptr_StreambufStream;
    pbStack_1b0 = ktx2Stream._streambuf;
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1b8;
    args.desc_ = 0xd;
    fmt.size_ = 2;
    fmt.data_ = "{}";
    ::fmt::v10::vprint(fmt,args);
    std::__cxx11::string::~string((string *)&ktx2Stream);
    PrintIndent::operator()(&out,2,(char (*) [5])0x1cdd65,&nl);
    ktx2Stream._vptr_StreambufStream = (_func_int **)pcVar7;
    PrintIndent::operator()(&out,1,(char (*) [6])0x1e185d,(char **)&ktx2Stream,&nl);
  }
  else {
    ktx2Stream._vptr_StreambufStream = (_func_int **)pcVar7;
    PrintIndent::operator()
              (&out,1,(char (*) [20])"\"messages\":{}[]{}{}",&space,(char **)&ktx2Stream,&nl);
  }
  std::istream::seekg((long)file,_S_beg);
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) == 0) {
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
              (&ktx2Stream,
               *(basic_streambuf<char,_std::char_traits<char>_> **)
                (file + *(long *)(*(long *)file + -0x18) + 0xe8),_S_in|_S_bin);
    kVar3 = ktxPrintKTX2InfoJSONForStream
                      (ktx2Stream._stream._M_t.
                       super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                       super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                       super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,iVar6,minified);
    PrintIndent::operator()(&out,0,(char (*) [5])0x1cdd65,&nl);
    kVar5 = KTX_SUCCESS;
    if (iVar1 == 0) {
      kVar5 = kVar3;
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (&ktx2Stream);
  }
  else {
    kVar5 = KTX_SUCCESS;
    PrintIndent::operator()(&out,0,(char (*) [5])0x1cdd65,&nl);
    if (iVar1 == 0) {
      kVar5 = KTX_FILE_SEEK_ERROR;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messagesOS);
  return kVar5;
}

Assistant:

KTX_error_code CommandInfo::printInfoJSON(std::istream& file, bool minified) {
    const auto base_indent = minified ? 0 : +0;
    const auto indent_width = minified ? 0 : 4;
    const auto space = minified ? "" : " ";
    const auto nl = minified ? "" : "\n";

    std::ostringstream messagesOS;
    PrintIndent pi{messagesOS, base_indent, indent_width};

    bool first = true;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        if (!std::exchange(first, false)) {
            pi(2, "}},{}", nl);
        }
        pi(2, "{{{}", nl);
        pi(3, "\"id\":{}{},{}", space, issue.id, nl);
        pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
        pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
        pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
    });

    file.clear(); // Clear any unexpected EOF from validation

    // Workaround detection to decide if ktx will produce any output into the json
    // to eliminate a trailing comma
    file.seekg(0, std::ios_base::end);
    const auto fileSize = file.tellg();
    bool fileIdentifierIsCorrect = false;
    if (fileSize >= 12) {
        static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;
        ktx_uint8_t identifier[12];
        file.seekg(0, std::ios_base::beg);
        file.read(reinterpret_cast<char*>(identifier), 12);
        fileIdentifierIsCorrect = std::memcmp(identifier, ktx2_identifier_reference, 12) == 0;
    }
    const auto ktxWillPrintOutput = fileIdentifierIsCorrect && fileSize >= KTX2_HEADER_SIZE;

    PrintIndent out{std::cout, base_indent, indent_width};
    out(0, "{{{}", nl);
    out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/info_v0.json\",{}", space, nl);
    out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
    if (!first) {
        out(1, "\"messages\":{}[{}", space, nl);
        fmt::print("{}", std::move(messagesOS).str());
        out(2, "}}{}", nl);
        out(1, "]{}{}", ktxWillPrintOutput ? "," : "", nl);
    } else {
        out(1, "\"messages\":{}[]{}{}", space, ktxWillPrintOutput ? "," : "", nl);
    }

    file.seekg(0, std::ios_base::beg);
    if (!file) {
        out(0, "}}{}", nl);
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;
    }

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoJSONForStream(ktx2Stream.stream(), base_indent + 1, indent_width, minified);
    out(0, "}}{}", nl);

    return validationResult == 0 ? result : KTX_SUCCESS;
}